

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::Cluster::Cluster(Cluster *this,uint64_t id,Element *element,Document *doc,string *name)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_00;
  const_iterator cVar1;
  Element *element_00;
  Element *element_01;
  Model *pMVar2;
  Element *el;
  _Rb_tree_header *p_Var3;
  Element *el_00;
  pointer ppCVar4;
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  WeightArray *local_60;
  WeightIndexArray *local_58;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_50
  ;
  Document *local_38;
  
  local_38 = doc;
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Cluster_008f3c88;
  local_60 = &this->weights;
  local_58 = &this->indices;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transform).a1 = 1.0;
  (this->transform).a2 = 0.0;
  (this->transform).a3 = 0.0;
  (this->transform).a4 = 0.0;
  (this->transform).b1 = 0.0;
  (this->transform).b2 = 1.0;
  (this->transform).b3 = 0.0;
  (this->transform).b4 = 0.0;
  (this->transform).c1 = 0.0;
  (this->transform).c2 = 0.0;
  (this->transform).c3 = 1.0;
  (this->transform).c4 = 0.0;
  (this->transform).d1 = 0.0;
  (this->transform).d2 = 0.0;
  (this->transform).d3 = 0.0;
  *(undefined8 *)&(this->transform).d4 = 0x3f8000003f800000;
  (this->transformLink).a2 = 0.0;
  (this->transformLink).a3 = 0.0;
  (this->transformLink).a4 = 0.0;
  (this->transformLink).b1 = 0.0;
  (this->transformLink).b2 = 1.0;
  (this->transformLink).b3 = 0.0;
  (this->transformLink).b4 = 0.0;
  (this->transformLink).c1 = 0.0;
  (this->transformLink).c2 = 0.0;
  (this->transformLink).c3 = 1.0;
  (this->transformLink).c4 = 0.0;
  (this->transformLink).d1 = 0.0;
  (this->transformLink).d2 = 0.0;
  (this->transformLink).d3 = 0.0;
  (this->transformLink).d4 = 1.0;
  this->node = (Model *)0x0;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)GetRequiredScope(element);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Indexes","");
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,(key_type *)local_a0);
  p_Var3 = &(this_00->_M_impl).super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var3) {
    el = (Element *)0x0;
  }
  else {
    el = *(Element **)(cVar1._M_node + 2);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
  }
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Weights","");
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(this_00,(key_type *)local_a0);
  if ((_Rb_tree_header *)cVar1._M_node == p_Var3) {
    el_00 = (Element *)0x0;
  }
  else {
    el_00 = *(Element **)(cVar1._M_node + 2);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
  }
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Transform","");
  element_00 = GetRequiredElement((Scope *)this_00,(string *)local_a0,element);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
  }
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"TransformLink","");
  element_01 = GetRequiredElement((Scope *)this_00,(string *)local_a0,element);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
  }
  ReadMatrix((aiMatrix4x4 *)local_a0,element_00);
  (this->transform).d1 = local_70;
  (this->transform).d2 = fStack_6c;
  (this->transform).d3 = fStack_68;
  (this->transform).d4 = fStack_64;
  (this->transform).c1 = local_80;
  (this->transform).c2 = fStack_7c;
  (this->transform).c3 = fStack_78;
  (this->transform).c4 = fStack_74;
  (this->transform).b1 = (float)local_a0._16_4_;
  (this->transform).b2 = (float)local_a0._20_4_;
  (this->transform).b3 = (float)local_a0._24_4_;
  (this->transform).b4 = (float)local_a0._28_4_;
  (this->transform).a1 = (float)local_a0._0_4_;
  (this->transform).a2 = (float)local_a0._4_4_;
  (this->transform).a3 = (float)local_a0._8_4_;
  (this->transform).a4 = (float)local_a0._12_4_;
  ReadMatrix((aiMatrix4x4 *)local_a0,element_01);
  (this->transformLink).d1 = local_70;
  (this->transformLink).d2 = fStack_6c;
  (this->transformLink).d3 = fStack_68;
  (this->transformLink).d4 = fStack_64;
  (this->transformLink).c1 = local_80;
  (this->transformLink).c2 = fStack_7c;
  (this->transformLink).c3 = fStack_78;
  (this->transformLink).c4 = fStack_74;
  (this->transformLink).b1 = (float)local_a0._16_4_;
  (this->transformLink).b2 = (float)local_a0._20_4_;
  (this->transformLink).b3 = (float)local_a0._24_4_;
  (this->transformLink).b4 = (float)local_a0._28_4_;
  (this->transformLink).a1 = (float)local_a0._0_4_;
  (this->transformLink).a2 = (float)local_a0._4_4_;
  (this->transformLink).a3 = (float)local_a0._8_4_;
  (this->transformLink).a4 = (float)local_a0._12_4_;
  if ((el_00 == (Element *)0x0) == (el != (Element *)0x0)) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"either Indexes or Weights are missing from Cluster","");
    Util::DOMError((string *)local_a0,element);
  }
  if (el != (Element *)0x0) {
    ParseVectorDataArray(local_58,el);
    ParseVectorDataArray(local_60,el_00);
  }
  if ((long)(this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"sizes of index and weight array don\'t match up","");
    Util::DOMError((string *)local_a0,element);
  }
  Document::GetConnectionsByDestinationSequenced
            (&local_50,local_38,(this->super_Deformer).super_Object.id,"Model");
  ppCVar4 = local_50.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar4 ==
        local_50.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_006160a4:
      if (this->node != (Model *)0x0) {
        if (local_50.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_50.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      local_a0._0_8_ = local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"failed to read target Node for Cluster","");
      Util::DOMError((string *)local_a0,element);
    }
    pMVar2 = Util::ProcessSimpleConnection<Assimp::FBX::Model>
                       (*ppCVar4,false,"Model -> Cluster",element,(char **)0x0);
    if (pMVar2 != (Model *)0x0) {
      this->node = pMVar2;
      goto LAB_006160a4;
    }
    ppCVar4 = ppCVar4 + 1;
  } while( true );
}

Assistant:

Cluster::Cluster(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Deformer(id,element,doc,name)
, node()
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Indexes = sc["Indexes"];
    const Element* const Weights = sc["Weights"];

    const Element& Transform = GetRequiredElement(sc,"Transform",&element);
    const Element& TransformLink = GetRequiredElement(sc,"TransformLink",&element);

    transform = ReadMatrix(Transform);
    transformLink = ReadMatrix(TransformLink);

    // it is actually possible that there be Deformer's with no weights
    if (!!Indexes != !!Weights) {
        DOMError("either Indexes or Weights are missing from Cluster",&element);
    }

    if(Indexes) {
        ParseVectorDataArray(indices,*Indexes);
        ParseVectorDataArray(weights,*Weights);
    }

    if(indices.size() != weights.size()) {
        DOMError("sizes of index and weight array don't match up",&element);
    }

    // read assigned node
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Model");
    for(const Connection* con : conns) {
        const Model* const mod = ProcessSimpleConnection<Model>(*con, false, "Model -> Cluster", element);
        if(mod) {
            node = mod;
            break;
        }
    }

    if (!node) {
        DOMError("failed to read target Node for Cluster",&element);
    }
}